

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

int move_towards(int8_t max,int rc,uint8_t *second,uint8_t *first)

{
  int delta;
  uint8_t *first_local;
  uint8_t *second_local;
  int rc_local;
  int8_t max_local;
  
  delta = (uint)*first - (uint)*second;
  if (delta == 0) {
    rc_local = rc + 1;
  }
  else {
    rc_local = rc;
    if (delta < 0) {
      delta = -delta;
      if (max <= delta) {
        delta = (int)max;
      }
      *first = *first + (char)delta;
    }
    else {
      if (max <= delta) {
        delta = (int)max;
      }
      *first = *first - (char)delta;
    }
  }
  return rc_local;
}

Assistant:

int move_towards(int8_t         max,
                 int            rc,
                 const uint8_t *second,
                 uint8_t       *first)
{
  int delta; /* was A */

  assert(max == 2 || max == 6);
  assert(rc < 2); /* Should not be called with otherwise. */
  assert(second != NULL);
  assert(first  != NULL);

  delta = *first - *second;
  if (delta == 0)
  {
    rc++;
  }
  else if (delta < 0) // delta -ve => second > first
  {
    delta = -delta; /* absolute value */
    if (delta >= max)
      delta = max;
    *first += delta; // move first towards second
  }
  else // delta +ve => first > second
  {
    if (delta >= max)
      delta = max;
    *first -= delta; // move first towards second
  }

  return rc;
}